

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O1

int ncnn::reduction_op_keepdims<ncnn::reduction_op_sumsq<float>,std::plus<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,Option *opt)

{
  float fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  Allocator *pAVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  int *piVar14;
  void *pvVar15;
  bool bVar16;
  long lVar17;
  void *pvVar18;
  long lVar19;
  void *pvVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  int unaff_R15D;
  float fVar25;
  void *ptr;
  Mat local_78;
  Allocator *local_38;
  
  sVar3 = a->elemsize;
  iVar2 = a->dims;
  if (iVar2 == 2) {
    uVar11 = a->w;
    uVar12 = (ulong)uVar11;
    iVar9 = a->h;
    lVar13 = (long)iVar9;
    if (reduce_w && reduce_h) {
      Mat::create(b,1,1,sVar3,opt->blob_allocator);
      local_38 = opt->workspace_allocator;
      if (iVar9 == 0) {
        piVar14 = (int *)0x0;
        pvVar15 = (void *)0x0;
      }
      else {
        uVar21 = sVar3 * lVar13 + 3 & 0xfffffffffffffffc;
        if (local_38 == (Allocator *)0x0) {
          local_78.data = (void *)0x0;
          iVar8 = posix_memalign(&local_78.data,0x10,uVar21 + 4);
          pvVar15 = local_78.data;
          if (iVar8 != 0) {
            local_78.data = (void *)0x0;
            pvVar15 = local_78.data;
          }
        }
        else {
          pvVar15 = (void *)(**(code **)(*(long *)local_38 + 0x10))(local_38,uVar21 + 4);
        }
        piVar14 = (int *)((long)pvVar15 + uVar21);
        *(undefined4 *)((long)pvVar15 + uVar21) = 1;
      }
      unaff_R15D = -100;
      if (iVar9 != 0 && pvVar15 != (void *)0x0) {
        if (0 < iVar9) {
          pvVar18 = a->data;
          iVar8 = a->w;
          sVar4 = a->elemsize;
          lVar17 = 0;
          do {
            fVar25 = 0.0;
            if (0 < (int)uVar11) {
              uVar21 = 0;
              do {
                fVar1 = *(float *)((long)pvVar18 + uVar21 * 4);
                fVar25 = fVar25 + fVar1 * fVar1;
                uVar21 = uVar21 + 1;
              } while (uVar12 != uVar21);
            }
            *(float *)((long)pvVar15 + lVar17 * 4) = fVar25;
            lVar17 = lVar17 + 1;
            pvVar18 = (void *)((long)pvVar18 + (long)iVar8 * sVar4);
          } while (lVar17 != lVar13);
        }
        fVar25 = 0.0;
        if (0 < iVar9) {
          lVar17 = 0;
          do {
            fVar25 = fVar25 + *(float *)((long)pvVar15 + lVar17 * 4);
            lVar17 = lVar17 + 1;
          } while (lVar13 != lVar17);
        }
        *(float *)b->data = fVar25;
        unaff_R15D = 0;
      }
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_38 != (Allocator *)0x0) {
            (**(code **)(*(long *)local_38 + 0x18))(local_38,pvVar15);
            goto LAB_0014539e;
          }
          if (pvVar15 != (void *)0x0) {
            free(pvVar15);
          }
          bVar16 = false;
          goto LAB_001453b6;
        }
      }
      bVar16 = false;
    }
    else if (reduce_w && !reduce_h) {
      Mat::create(b,1,iVar9,sVar3,opt->blob_allocator);
      if (0 < iVar9) {
        pvVar15 = a->data;
        iVar9 = a->w;
        pvVar18 = b->data;
        sVar4 = a->elemsize;
        lVar17 = 0;
        do {
          fVar25 = 0.0;
          if (0 < (int)uVar11) {
            uVar21 = 0;
            do {
              fVar1 = *(float *)((long)pvVar15 + uVar21 * 4);
              fVar25 = fVar25 + fVar1 * fVar1;
              uVar21 = uVar21 + 1;
            } while (uVar12 != uVar21);
          }
          *(float *)((long)pvVar18 + lVar17 * 4) = fVar25;
          lVar17 = lVar17 + 1;
          pvVar15 = (void *)((long)pvVar15 + (long)iVar9 * sVar4);
        } while (lVar17 != lVar13);
        goto LAB_0014527d;
      }
      unaff_R15D = 0;
LAB_0014539e:
      bVar16 = false;
    }
    else if (reduce_h && !reduce_w) {
      Mat::create(b,uVar11,1,sVar3,opt->blob_allocator);
      uVar10 = b->c * (int)b->cstep;
      if (0 < (int)uVar10) {
        memset(b->data,0,(ulong)uVar10 << 2);
      }
      if (0 < iVar9) {
        pvVar15 = a->data;
        iVar9 = a->w;
        pvVar18 = b->data;
        sVar4 = a->elemsize;
        lVar17 = 0;
        do {
          if (0 < (int)uVar11) {
            uVar21 = 0;
            do {
              fVar25 = *(float *)((long)pvVar15 + uVar21 * 4);
              *(float *)((long)pvVar18 + uVar21 * 4) =
                   fVar25 * fVar25 + *(float *)((long)pvVar18 + uVar21 * 4);
              uVar21 = uVar21 + 1;
            } while (uVar12 != uVar21);
          }
          lVar17 = lVar17 + 1;
          pvVar15 = (void *)((long)pvVar15 + (long)iVar9 * sVar4);
        } while (lVar17 != lVar13);
      }
LAB_0014527d:
      bVar16 = false;
      unaff_R15D = 0;
    }
    else {
      bVar16 = true;
    }
LAB_001453b6:
    if (!bVar16) {
      return unaff_R15D;
    }
  }
  else if (iVar2 == 1) {
    iVar2 = a->w;
    Mat::create(b,1,sVar3,opt->blob_allocator);
    if ((long)iVar2 < 1) {
      fVar25 = 0.0;
    }
    else {
      fVar25 = 0.0;
      lVar13 = 0;
      do {
        fVar1 = *(float *)((long)a->data + lVar13 * 4);
        fVar25 = fVar25 + fVar1 * fVar1;
        lVar13 = lVar13 + 1;
      } while (iVar2 != lVar13);
    }
    *(float *)b->data = fVar25;
    return 0;
  }
  if (iVar2 != 3) {
    return 0;
  }
  uVar11 = a->w;
  uVar12 = (ulong)uVar11;
  uVar10 = a->h;
  uVar21 = (ulong)uVar10;
  iVar2 = a->c;
  lVar13 = (long)iVar2;
  uVar23 = uVar10 * uVar11;
  bVar16 = !reduce_w;
  if ((!bVar16 && reduce_h) && reduce_c) {
    Mat::create(b,1,1,1,sVar3,opt->blob_allocator);
    pAVar7 = opt->workspace_allocator;
    if (iVar2 == 0) {
      piVar14 = (int *)0x0;
      pvVar15 = (void *)0x0;
    }
    else {
      uVar12 = sVar3 * lVar13 + 3 & 0xfffffffffffffffc;
      if (pAVar7 == (Allocator *)0x0) {
        local_78.data = (void *)0x0;
        iVar9 = posix_memalign(&local_78.data,0x10,uVar12 + 4);
        pvVar15 = local_78.data;
        if (iVar9 != 0) {
          local_78.data = (void *)0x0;
          pvVar15 = local_78.data;
        }
      }
      else {
        pvVar15 = (void *)(**(code **)(*(long *)pAVar7 + 0x10))(pAVar7,uVar12 + 4);
      }
      piVar14 = (int *)((long)pvVar15 + uVar12);
      *(undefined4 *)((long)pvVar15 + uVar12) = 1;
    }
    unaff_R15D = -100;
    if (iVar2 != 0 && pvVar15 != (void *)0x0) {
      if (0 < iVar2) {
        pvVar18 = a->data;
        sVar3 = a->cstep;
        sVar4 = a->elemsize;
        lVar17 = 0;
        do {
          fVar25 = 0.0;
          if (0 < (int)uVar23) {
            uVar12 = 0;
            do {
              fVar1 = *(float *)((long)pvVar18 + uVar12 * 4);
              fVar25 = fVar25 + fVar1 * fVar1;
              uVar12 = uVar12 + 1;
            } while (uVar23 != uVar12);
          }
          *(float *)((long)pvVar15 + lVar17 * 4) = fVar25;
          lVar17 = lVar17 + 1;
          pvVar18 = (void *)((long)pvVar18 + sVar3 * sVar4);
        } while (lVar17 != lVar13);
      }
      fVar25 = 0.0;
      if (0 < iVar2) {
        lVar17 = 0;
        do {
          fVar25 = fVar25 + *(float *)((long)pvVar15 + lVar17 * 4);
          lVar17 = lVar17 + 1;
        } while (lVar13 != lVar17);
      }
      *(float *)b->data = fVar25;
      unaff_R15D = 0;
    }
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        if (pAVar7 == (Allocator *)0x0) {
          if (pvVar15 != (void *)0x0) {
            free(pvVar15);
          }
        }
        else {
          (**(code **)(*(long *)pAVar7 + 0x18))(pAVar7,pvVar15);
        }
      }
    }
LAB_00145b1a:
    bVar16 = false;
  }
  else {
    if ((!bVar16 && reduce_h) && !reduce_c) {
      Mat::create(b,1,1,iVar2,sVar3,opt->blob_allocator);
      if (0 < iVar2) {
        pvVar15 = a->data;
        sVar3 = a->cstep;
        pvVar18 = b->data;
        sVar4 = b->cstep;
        sVar5 = b->elemsize;
        sVar6 = a->elemsize;
        lVar17 = 0;
        do {
          fVar25 = 0.0;
          if (0 < (int)uVar23) {
            uVar12 = 0;
            do {
              fVar1 = *(float *)((long)pvVar15 + uVar12 * 4);
              fVar25 = fVar25 + fVar1 * fVar1;
              uVar12 = uVar12 + 1;
            } while (uVar23 != uVar12);
          }
          *(float *)((long)pvVar18 + sVar4 * sVar5 * lVar17) = fVar25;
          lVar17 = lVar17 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar3 * sVar6);
        } while (lVar17 != lVar13);
      }
    }
    else {
      lVar17 = (long)(int)uVar11;
      if ((bVar16 || reduce_h) || reduce_c) {
        if ((!bVar16 && !reduce_h) && reduce_c) {
          Mat::create(b,1,uVar10,1,sVar3,opt->blob_allocator);
          local_78.elemsize._0_4_ = 0;
          local_78.elemsize._4_4_ = 0;
          local_78.elempack = 0;
          local_78.data = (void *)0x0;
          local_78.refcount._0_4_ = 0;
          local_78.refcount._4_4_ = 0;
          local_78.allocator = (Allocator *)0x0;
          local_78.dims = 0;
          local_78.w = 0;
          local_78.h = 0;
          local_78.c = 0;
          local_78.cstep = 0;
          Mat::create(&local_78,1,uVar10,iVar2,sVar3,opt->workspace_allocator);
          unaff_R15D = -100;
          if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
            if (0 < local_78.c * (int)local_78.cstep) {
              memset(local_78.data,0,(ulong)(uint)(local_78.c * (int)local_78.cstep) << 2);
            }
            if (0 < iVar2) {
              pvVar15 = a->data;
              sVar3 = a->cstep;
              sVar4 = a->elemsize;
              lVar19 = 0;
              do {
                if (0 < (int)uVar10) {
                  uVar22 = 0;
                  pvVar18 = pvVar15;
                  do {
                    fVar25 = 0.0;
                    if (0 < (int)uVar11) {
                      uVar24 = 0;
                      do {
                        fVar1 = *(float *)((long)pvVar18 + uVar24 * 4);
                        fVar25 = fVar25 + fVar1 * fVar1;
                        uVar24 = uVar24 + 1;
                      } while (uVar12 != uVar24);
                    }
                    *(float *)((long)local_78.data +
                              uVar22 * 4 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) *
                              lVar19) = fVar25;
                    uVar22 = uVar22 + 1;
                    pvVar18 = (void *)((long)pvVar18 + lVar17 * 4);
                  } while (uVar22 != uVar21);
                }
                lVar19 = lVar19 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar3 * sVar4);
              } while (lVar19 != lVar13);
            }
            uVar11 = b->c * (int)b->cstep;
            if (0 < (int)uVar11) {
              memset(b->data,0,(ulong)uVar11 << 2);
            }
            if (0 < iVar2) {
              pvVar15 = b->data;
              lVar17 = 0;
              pvVar18 = local_78.data;
              do {
                if (0 < (int)uVar10) {
                  uVar12 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar12 * 4) =
                         *(float *)((long)pvVar18 + uVar12 * 4) +
                         *(float *)((long)pvVar15 + uVar12 * 4);
                    uVar12 = uVar12 + 1;
                  } while (uVar21 != uVar12);
                }
                lVar17 = lVar17 + 1;
                pvVar18 = (void *)((long)pvVar18 +
                                  local_78.cstep *
                                  CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
              } while (lVar17 != lVar13);
            }
LAB_00145b0d:
            unaff_R15D = 0;
          }
        }
        else {
          if ((!reduce_h || reduce_w) || !reduce_c) {
            if ((!reduce_w && !reduce_h) && reduce_c) {
              Mat::create(b,uVar11,uVar10,1,sVar3,opt->blob_allocator);
              uVar11 = b->c * (int)b->cstep;
              if (0 < (int)uVar11) {
                memset(b->data,0,(ulong)uVar11 << 2);
              }
              if (0 < iVar2) {
                sVar3 = a->cstep;
                sVar4 = a->elemsize;
                pvVar15 = a->data;
                pvVar18 = b->data;
                lVar17 = 0;
                unaff_R15D = 0;
                do {
                  if (0 < (int)uVar23) {
                    uVar12 = 0;
                    do {
                      fVar25 = *(float *)((long)pvVar15 + uVar12 * 4);
                      *(float *)((long)pvVar18 + uVar12 * 4) =
                           fVar25 * fVar25 + *(float *)((long)pvVar18 + uVar12 * 4);
                      uVar12 = uVar12 + 1;
                    } while (uVar23 != uVar12);
                  }
                  lVar17 = lVar17 + 1;
                  pvVar15 = (void *)((long)pvVar15 + sVar3 * sVar4);
                  bVar16 = false;
                } while (lVar17 != lVar13);
                goto LAB_00145b1c;
              }
            }
            else {
              bVar16 = true;
              if ((!reduce_h || reduce_w) || reduce_c) goto LAB_00145b1c;
              Mat::create(b,uVar11,1,iVar2,sVar3,opt->blob_allocator);
              uVar23 = b->c * (int)b->cstep;
              if (0 < (int)uVar23) {
                memset(b->data,0,(ulong)uVar23 << 2);
              }
              if (0 < iVar2) {
                pvVar15 = a->data;
                sVar3 = a->cstep;
                pvVar18 = b->data;
                sVar4 = b->cstep;
                sVar5 = a->elemsize;
                sVar6 = b->elemsize;
                lVar19 = 0;
                unaff_R15D = 0;
                do {
                  if (0 < (int)uVar10) {
                    uVar23 = 0;
                    pvVar20 = pvVar15;
                    do {
                      if (0 < (int)uVar11) {
                        uVar21 = 0;
                        do {
                          fVar25 = *(float *)((long)pvVar20 + uVar21 * 4);
                          *(float *)((long)pvVar18 + uVar21 * 4) =
                               fVar25 * fVar25 + *(float *)((long)pvVar18 + uVar21 * 4);
                          uVar21 = uVar21 + 1;
                        } while (uVar12 != uVar21);
                      }
                      uVar23 = uVar23 + 1;
                      pvVar20 = (void *)((long)pvVar20 + lVar17 * 4);
                    } while (uVar23 != uVar10);
                  }
                  lVar19 = lVar19 + 1;
                  pvVar15 = (void *)((long)pvVar15 + sVar3 * sVar5);
                  pvVar18 = (void *)((long)pvVar18 + sVar4 * sVar6);
                  bVar16 = false;
                } while (lVar19 != lVar13);
                goto LAB_00145b1c;
              }
            }
            goto LAB_001456c2;
          }
          Mat::create(b,uVar11,1,1,sVar3,opt->blob_allocator);
          local_78.elemsize._0_4_ = 0;
          local_78.elemsize._4_4_ = 0;
          local_78.elempack = 0;
          local_78.data = (void *)0x0;
          local_78.refcount._0_4_ = 0;
          local_78.refcount._4_4_ = 0;
          local_78.allocator = (Allocator *)0x0;
          local_78.dims = 0;
          local_78.w = 0;
          local_78.h = 0;
          local_78.c = 0;
          local_78.cstep = 0;
          Mat::create(&local_78,uVar11,1,iVar2,sVar3,opt->workspace_allocator);
          unaff_R15D = -100;
          if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
            if (0 < local_78.c * (int)local_78.cstep) {
              memset(local_78.data,0,(ulong)(uint)(local_78.c * (int)local_78.cstep) << 2);
            }
            if (0 < iVar2) {
              pvVar15 = a->data;
              sVar3 = a->cstep;
              sVar4 = a->elemsize;
              lVar19 = 0;
              pvVar18 = local_78.data;
              do {
                if (0 < (int)uVar10) {
                  uVar23 = 0;
                  pvVar20 = pvVar15;
                  do {
                    if (0 < (int)uVar11) {
                      uVar21 = 0;
                      do {
                        fVar25 = *(float *)((long)pvVar20 + uVar21 * 4);
                        *(float *)((long)pvVar18 + uVar21 * 4) =
                             fVar25 * fVar25 + *(float *)((long)pvVar18 + uVar21 * 4);
                        uVar21 = uVar21 + 1;
                      } while (uVar12 != uVar21);
                    }
                    uVar23 = uVar23 + 1;
                    pvVar20 = (void *)((long)pvVar20 + lVar17 * 4);
                  } while (uVar23 != uVar10);
                }
                lVar19 = lVar19 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar3 * sVar4);
                pvVar18 = (void *)((long)pvVar18 +
                                  local_78.cstep *
                                  CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
              } while (lVar19 != lVar13);
            }
            uVar10 = b->c * (int)b->cstep;
            if (0 < (int)uVar10) {
              memset(b->data,0,(ulong)uVar10 << 2);
            }
            if (0 < iVar2) {
              pvVar15 = b->data;
              lVar17 = 0;
              pvVar18 = local_78.data;
              do {
                if (0 < (int)uVar11) {
                  uVar21 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar21 * 4) =
                         *(float *)((long)pvVar18 + uVar21 * 4) +
                         *(float *)((long)pvVar15 + uVar21 * 4);
                    uVar21 = uVar21 + 1;
                  } while (uVar12 != uVar21);
                }
                lVar17 = lVar17 + 1;
                pvVar18 = (void *)((long)pvVar18 +
                                  local_78.cstep *
                                  CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
              } while (lVar17 != lVar13);
            }
            goto LAB_00145b0d;
          }
        }
        Mat::~Mat(&local_78);
        goto LAB_00145b1a;
      }
      Mat::create(b,1,uVar10,iVar2,sVar3,opt->blob_allocator);
      if (0 < iVar2) {
        pvVar15 = a->data;
        sVar3 = a->cstep;
        sVar4 = b->cstep;
        sVar5 = b->elemsize;
        sVar6 = a->elemsize;
        pvVar18 = b->data;
        lVar19 = 0;
        do {
          if (0 < (int)uVar10) {
            uVar22 = 0;
            pvVar20 = pvVar15;
            do {
              fVar25 = 0.0;
              if (0 < (int)uVar11) {
                uVar24 = 0;
                do {
                  fVar1 = *(float *)((long)pvVar20 + uVar24 * 4);
                  fVar25 = fVar25 + fVar1 * fVar1;
                  uVar24 = uVar24 + 1;
                } while (uVar12 != uVar24);
              }
              *(float *)((long)pvVar18 + uVar22 * 4 + sVar4 * sVar5 * lVar19) = fVar25;
              uVar22 = uVar22 + 1;
              pvVar20 = (void *)((long)pvVar20 + lVar17 * 4);
            } while (uVar22 != uVar21);
          }
          lVar19 = lVar19 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar3 * sVar6);
        } while (lVar19 != lVar13);
      }
    }
LAB_001456c2:
    bVar16 = false;
    unaff_R15D = 0;
  }
LAB_00145b1c:
  if (bVar16) {
    return 0;
  }
  return unaff_R15D;
}

Assistant:

static int reduction_op_keepdims(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, const Option& opt)
{
    Op op;
    Op2 op2;

    size_t elemsize = a.elemsize;
    int dims = a.dims;

    if (dims == 1)
    {
        int w = a.w;
        b.create(1, elemsize, opt.blob_allocator);
        const float* ptr = a;

        float sum = v0;
        for (int i=0; i<w; i++)
        {
            sum = op(sum, ptr[i]);
        }
        b[0] = sum;

        return 0;
    }

    if (dims == 2)
    {
        int w = a.w;
        int h = a.h;

        if (reduce_w && reduce_h)
        {
            // w h -> 1 1
            b.create(1, 1, elemsize, opt.blob_allocator);

            Mat sums(h, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                sums[i] = sum;
            }

            float sum = v0;
            for (int i=0; i<h; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && !reduce_h)
        {
            // w h -> 1 h
            b.create(1, h, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                b[i] = sum;
            }

            return 0;
        }

        if (!reduce_w && reduce_h)
        {
            // w h -> w 1
            b.create(w, 1, elemsize, opt.blob_allocator);
            b.fill(v0);

            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);
                for (int j=0; j<w; j++)
                {
                    b[j] = op(b[j], ptr[j]);
                }
            }

            return 0;
        }
    }

    if (dims == 3)
    {
        int w = a.w;
        int h = a.h;
        int channels = a.c;
        int size = w * h;

        if (reduce_w && reduce_h && reduce_c)
        {
            // w h c -> 1 1 1
            b.create(1, 1, 1, elemsize, opt.blob_allocator);
            Mat sums(channels, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i=0; i<size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                sums[q] = sum;
            }

            float sum = v0;
            for (int i=0; i<channels; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> 1 1 c
            b.create(1, 1, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                float sum = v0;
                for (int i=0; i<size; i++)
                {
                    sum = op(sum, ptr[i]);
                }

                outptr[0] = sum;
            }

            return 0;
        }

        if (reduce_w && !reduce_h && !reduce_c)
        {
            // w h c -> 1 h c
            b.create(1, h, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                for (int i=0; i<h; i++)
                {
                    float sum = v0;
                    for (int j=0; j<w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    outptr[i] = sum;
                    ptr += w;
                }
            }

            return 0;
        }

        if (reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> 1 h 1
            b.create(1, h, 1, elemsize, opt.blob_allocator);

            Mat mins(1, h, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i=0; i<h; i++)
                {
                    float sum = v0;
                    for (int j=0; j<w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    mins_ptr[i] = sum;
                    ptr += w;
                }
            }
            
            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int i=0; i<h; i++)
                {
                    b[i] = op2(b[i], mins_ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && reduce_c)
        {
            // w h c -> w 1 1
            b.create(w, 1, 1, elemsize, opt.blob_allocator);

            Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i=0; i<h; i++)
                {
                    for (int j=0; j<w; j++)
                    {
                        mins_ptr[j] = op(mins_ptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int j=0; j<w; j++)
                {
                    b[j] = op2(b[j], mins_ptr[j]);
                }
            }

            return 0;
        }

        if (!reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> w h 1
            b.create(w, h, 1, elemsize, opt.blob_allocator);

            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                for (int i=0; i<size; i++)
                {
                    b[i] = op(b[i], ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> w 1 c
            b.create(w, 1, channels, elemsize, opt.blob_allocator);
            b.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                for (int i=0; i<h; i++)
                {
                    for (int j=0; j<w; j++)
                    {
                        outptr[j] = op(outptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            return 0;
        }
    }

    return 0;
}